

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  int in_EAX;
  int extraout_EAX;
  size_t sVar2;
  ostream *poVar3;
  size_t sVar4;
  pointer text;
  Columns headerCols;
  Spacer spacer;
  Columns local_a8;
  Column local_90;
  value_type local_60;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    if (0 < this->m_currentColumn) {
      local_60.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)&local_60,1);
      this->m_currentColumn = -1;
    }
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clara::TextFlow::Spacer::Spacer((Spacer *)&local_60,2);
    text = (this->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (text != pCVar1) {
      do {
        clara::TextFlow::Column::Column(&local_90,&text->name);
        sVar2 = (long)text->width - 2;
        if ((int)sVar2 == 0) {
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/dependencies/Catch2/single_include/catch2/catch.hpp"
                        ,0x21b0,"Column &Catch::clara::TextFlow::Column::width(size_t)");
        }
        local_90.m_width = sVar2;
        clara::std::
        vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
        push_back(&local_a8.m_columns,&local_90);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90.m_strings);
        clara::std::
        vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
        push_back(&local_a8.m_columns,&local_60);
        text = text + 1;
      } while (text != pCVar1);
    }
    poVar3 = clara::TextFlow::operator<<(this->m_os,&local_a8);
    local_90.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
    poVar3 = this->m_os;
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam0000000000196350 = 0x2d2d2d2d2d2d2d;
      uRam0000000000196357 = 0x2d2d2d2d2d2d2d2d;
      _DAT_00196340 = 0x2d2d2d2d2d2d2d2d;
      uRam0000000000196348 = 0x2d2d2d2d2d2d2d;
      DAT_0019634f = 0x2d;
      _DAT_00196330 = 0x2d2d2d2d2d2d2d2d;
      uRam0000000000196338 = 0x2d2d2d2d2d2d2d2d;
      _DAT_00196320 = 0x2d2d2d2d2d2d2d2d;
      uRam0000000000196328 = 0x2d2d2d2d2d2d2d2d;
      _line = 0x2d2d2d2d2d2d2d2d;
      uRam0000000000196318 = 0x2d2d2d2d2d2d2d2d;
      DAT_0019635f = 0;
    }
    sVar4 = strlen(&getLineOfChars<(char)45>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,&getLineOfChars<(char)45>()::line,sVar4);
    local_90.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60.m_strings);
    clara::std::
    vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::~vector
              (&local_a8.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			Columns headerCols;
			Spacer spacer(2);
			for (auto const& info : m_columnInfos) {
				headerCols += Column(info.name).width(static_cast<std::size_t>(info.width - 2));
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << Catch::getLineOfChars<'-'>() << '\n';
        }
    }